

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepCompositing.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepCompositing::composite_pixel
          (DeepCompositing *this,float *outputs,float **inputs,char **channel_names,int num_channels
          ,int num_samples,int sources)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> sort_order;
  _Vector_base<int,_std::allocator<int>_> local_58;
  DeepCompositing *local_40;
  char **local_38;
  
  uVar2 = 0;
  uVar6 = 0;
  if (0 < num_channels) {
    uVar6 = (ulong)(uint)num_channels;
  }
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    outputs[uVar2] = 0.0;
  }
  if (num_samples != 0) {
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (sources < 2) {
      uVar2 = (ulong)(uint)num_samples;
      if (num_samples < 1) {
        uVar2 = 0;
      }
    }
    else {
      local_40 = this;
      local_38 = channel_names;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&local_58,(long)num_samples);
      uVar3 = 0;
      uVar2 = 0;
      if (0 < num_samples) {
        uVar2 = (ulong)(uint)num_samples;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        local_58._M_impl.super__Vector_impl_data._M_start[uVar3] = (int)uVar3;
      }
      (*local_40->_vptr_DeepCompositing[3])
                (local_40,local_58._M_impl.super__Vector_impl_data._M_start,inputs,local_38,
                 (ulong)(uint)num_channels,(ulong)(uint)num_samples,sources);
    }
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      iVar4 = (int)uVar3;
      if (1 < sources) {
        iVar4 = local_58._M_impl.super__Vector_impl_data._M_start[uVar3];
      }
      fVar1 = outputs[2];
      if (1.0 <= fVar1) break;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        outputs[uVar5] = inputs[uVar5][iVar4] * (1.0 - fVar1) + outputs[uVar5];
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  }
  return;
}

Assistant:

void
DeepCompositing::composite_pixel (
    float        outputs[],
    const float* inputs[],
    const char*  channel_names[],
    int          num_channels,
    int          num_samples,
    int          sources)
{
    for (int i = 0; i < num_channels; i++)
        outputs[i] = 0.0;
    // no samples? do nothing
    if (num_samples == 0) { return; }

    vector<int> sort_order;
    if (sources > 1)
    {
        sort_order.resize (num_samples);
        for (int i = 0; i < num_samples; i++)
            sort_order[i] = i;
        sort (
            &sort_order[0],
            inputs,
            channel_names,
            num_channels,
            num_samples,
            sources);
    }

    for (int i = 0; i < num_samples; i++)
    {
        int   s     = (sources > 1) ? sort_order[i] : i;
        float alpha = outputs[2];
        if (alpha >= 1.0f) return;

        for (int c = 0; c < num_channels; c++)
        {
            outputs[c] += (1.0f - alpha) * inputs[c][s];
        }
    }
}